

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O1

int rfc5444_seqno_difference(uint16_t seqno1,uint16_t seqno2)

{
  int iVar1;
  undefined2 in_register_00000032;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,seqno1) - CONCAT22(in_register_00000032,seqno2);
  iVar1 = iVar2 + 0x10000;
  if (-0x8001 < iVar2) {
    iVar1 = iVar2;
  }
  if (0x8000 < iVar2) {
    iVar1 = iVar2 + -0x10000;
  }
  return iVar1;
}

Assistant:

int
rfc5444_seqno_difference(uint16_t seqno1, uint16_t seqno2) {
  int diff = (int)seqno1 - (int)(seqno2);

  // overflow ?
  if (diff > (1 << 15)) {
    diff -= (1 << 16);
  }
  else if (diff < -(1 << 15)) {
    diff += (1 << 16);
  }
  return diff;
}